

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O1

int Of_CutRef_rec(Of_Man_t *p,int *pCut)

{
  Of_Obj_t *pOVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  
  iVar2 = 1;
  if ((p->Iter & 1) == 0) {
    iVar2 = 0;
    if (1 < (*pCut & 0x1fU)) {
      iVar2 = (*pCut & 0x1fU) + p->pPars->nAreaTuner;
    }
  }
  if ((*pCut & 0x1f) != 0) {
    uVar6 = 0;
    do {
      uVar3 = pCut[uVar6 + 1];
      if ((int)uVar3 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf2,"int Abc_Lit2Var(int)");
      }
      if (uVar3 < 2) {
        return iVar2;
      }
      uVar3 = uVar3 >> 1;
      pOVar1 = p->pObjs;
      if ((pOVar1[uVar3].iCutH != 0) &&
         (iVar4 = pOVar1[uVar3].nRefs, pOVar1[uVar3].nRefs = iVar4 + 1, iVar4 == 0)) {
        if (p->pGia->nObjs <= (int)uVar3) {
          __assert_fail("iObj>0 && iObj<Gia_ManObjNum(p->pGia)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaOf.c"
                        ,0x90,"int *Of_ObjCutBestP(Of_Man_t *, int)");
        }
        uVar5 = pOVar1[uVar3].iCutH >> 0x10;
        if (((int)uVar5 < 0) || ((p->vPages).nSize <= (int)uVar5)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        iVar4 = Of_CutRef_rec(p,(int *)((ulong)((pOVar1[uVar3].iCutH & 0xffffU) << 2) +
                                       (long)(p->vPages).pArray[uVar5]));
        iVar2 = iVar2 + iVar4;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (*pCut & 0x1f));
  }
  return iVar2;
}

Assistant:

int Of_CutRef_rec( Of_Man_t * p, int * pCut )
{
    int i, Var, Count = (p->Iter & 1) ? 1 : Of_CutArea(p, Of_CutSize(pCut));
    Of_CutForEachVar( pCut, Var, i )
        if ( Of_ObjCutBest(p, Var) && !Of_ObjRefInc(p, Var) )
            Count += Of_CutRef_rec( p, Of_ObjCutBestP(p, Var) );
    return Count;
}